

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O1

Optional<unsigned_long> __thiscall llvm::DWARFDie::getHighPC(DWARFDie *this,uint64_t LowPC)

{
  bool bVar1;
  ulong uVar2;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar3;
  ulong uVar4;
  Optional<llvm::DWARFFormValue> *__return_storage_ptr__;
  ulong uVar5;
  Optional<unsigned_long> OVar6;
  undefined1 local_70 [8];
  Optional<llvm::DWARFFormValue> FormValue;
  
  __return_storage_ptr__ = (Optional<llvm::DWARFFormValue> *)local_70;
  find(__return_storage_ptr__,this,DW_AT_high_pc);
  bVar1 = true;
  uVar4 = 0;
  if (FormValue.Storage.field_0._40_1_ == '\x01') {
    FormValue.Storage._48_8_ = LowPC;
    OVar6 = DWARFFormValue::getAsAddress((DWARFFormValue *)local_70);
    aVar3 = OVar6.Storage.field_0;
    __return_storage_ptr__ = (Optional<llvm::DWARFFormValue> *)(ulong)OVar6.Storage._8_4_;
    uVar5 = aVar3.value >> 8;
    if (((undefined1  [16])OVar6.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      if (FormValue.Storage.field_0._40_1_ == '\0') {
        __assert_fail("hasVal",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                      ,0xad,
                      "T &llvm::optional_detail::OptionalStorage<llvm::DWARFFormValue>::getValue() & [T = llvm::DWARFFormValue]"
                     );
      }
      OVar6 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_70);
      if (((undefined1  [16])OVar6.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        aVar3.value = OVar6.Storage.field_0.value + FormValue.Storage._48_8_;
        uVar5 = aVar3.value >> 8;
        __return_storage_ptr__ = (Optional<llvm::DWARFFormValue> *)0x1;
        bVar1 = false;
      }
    }
    else {
      bVar1 = false;
    }
  }
  else {
    aVar3.value = 0;
    uVar5 = 0;
  }
  uVar2 = uVar4;
  if (!bVar1) {
    uVar4 = aVar3.value & 0xff;
    uVar2 = (ulong)__return_storage_ptr__ & 0xff;
  }
  OVar6.Storage._8_8_ = uVar2;
  OVar6.Storage.field_0.value = uVar4 | uVar5 << 8;
  return (Optional<unsigned_long>)OVar6.Storage;
}

Assistant:

Optional<uint64_t> DWARFDie::getHighPC(uint64_t LowPC) const {
  if (auto FormValue = find(DW_AT_high_pc)) {
    if (auto Address = FormValue->getAsAddress()) {
      // High PC is an address.
      return Address;
    }
    if (auto Offset = FormValue->getAsUnsignedConstant()) {
      // High PC is an offset from LowPC.
      return LowPC + *Offset;
    }
  }
  return None;
}